

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O2

void trt_pose::parse::find_peaks_out_hw
               (int *counts,int *peaks,float *input,int H,int W,int M,float threshold,
               int window_size)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  iVar9 = window_size / 2 + 1;
  uVar2 = (ulong)(uint)-(window_size / 2);
  lVar14 = (long)W;
  lVar10 = 0;
  iVar15 = 0;
  uVar4 = uVar2;
  while( true ) {
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    if ((H <= lVar10) || (M <= iVar15)) break;
    iVar5 = iVar9 + (int)lVar10;
    if (H <= iVar5) {
      iVar5 = H;
    }
    lVar12 = 0;
    uVar3 = uVar2;
    while( true ) {
      uVar13 = 0;
      if (0 < (int)uVar3) {
        uVar13 = uVar3;
      }
      if ((lVar14 <= lVar12) || (M <= iVar15)) break;
      if (threshold <= input[lVar10 * lVar14 + lVar12]) {
        iVar6 = iVar9 + (int)lVar12;
        if (W <= iVar6) {
          iVar6 = W;
        }
        bVar1 = true;
        pfVar11 = (float *)(lVar14 * 4 * uVar7 + (long)input);
        for (uVar16 = uVar7; uVar8 = uVar13, (long)uVar16 < (long)iVar5; uVar16 = uVar16 + 1) {
          for (; (long)uVar8 < (long)iVar6; uVar8 = uVar8 + 1) {
            bVar1 = (bool)(bVar1 & pfVar11[uVar8] <= input[lVar10 * lVar14 + lVar12]);
          }
          pfVar11 = pfVar11 + lVar14;
        }
        if (bVar1) {
          peaks[iVar15 * 2] = (int)lVar10;
          peaks[iVar15 * 2 + 1] = (int)lVar12;
          iVar15 = iVar15 + 1;
        }
      }
      lVar12 = lVar12 + 1;
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    lVar10 = lVar10 + 1;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  *counts = iVar15;
  return;
}

Assistant:

void find_peaks_out_hw(int *counts,        // 1
                       int *peaks,         // Mx2
                       const float *input, // HxW
                       const int H, const int W, const int M,
                       const float threshold, const int window_size) {
  int win = window_size / 2;
  int count = 0;

  for (int i = 0; i < H && count < M; i++) {
    for (int j = 0; j < W && count < M; j++) {
      float val = input[i * W + j];

      // skip if below threshold
      if (val < threshold)
        continue;

      // compute window bounds
      int ii_min = MAX(i - win, 0);
      int jj_min = MAX(j - win, 0);
      int ii_max = MIN(i + win + 1, H);
      int jj_max = MIN(j + win + 1, W);

      // search for larger value in window
      bool is_peak = true;
      for (int ii = ii_min; ii < ii_max; ii++) {
        for (int jj = jj_min; jj < jj_max; jj++) {
          if (input[ii * W + jj] > val) {
            is_peak = false;
          }
        }
      }

      // add peak
      if (is_peak) {
        peaks[count * 2] = i;
        peaks[count * 2 + 1] = j;
        count++;
      }
    }
  }

  *counts = count;
}